

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void convertToWithoutRowidTable(Parse *pParse,Table *pTab)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  sqlite3 *db;
  Vdbe *pVVar6;
  Column *pCVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  Op *pOVar12;
  size_t sVar13;
  Expr *pExpr;
  ExprList *pList;
  long lVar14;
  RenameToken *pRVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  short *psVar19;
  Index *pIdx;
  ulong uVar20;
  uint uVar21;
  char cVar22;
  Token ipkToken;
  Token local_40;
  
  db = pParse->db;
  pVVar6 = pParse->pVdbe;
  if (((db->init).field_0x6 & 2) == 0) {
    if (0 < pTab->nCol) {
      lVar11 = 8;
      lVar14 = 0;
      do {
        pCVar7 = pTab->aCol;
        if (((*(byte *)((long)&pCVar7->zCnName + lVar11 + 6) & 1) != 0) &&
           (bVar2 = *(byte *)((long)&pCVar7->zCnName + lVar11), (bVar2 & 0xf) == 0)) {
          *(byte *)((long)&pCVar7->zCnName + lVar11) = bVar2 | 2;
        }
        lVar14 = lVar14 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar14 < pTab->nCol);
    }
    pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  if ((long)(pParse->u1).addrCrTab != 0) {
    if (pVVar6->db->mallocFailed == '\0') {
      pOVar12 = pVVar6->aOp + (pParse->u1).addrCrTab;
    }
    else {
      pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar12->p3 = 2;
  }
  if ((long)pTab->iPKey < 0) {
    for (pParse = (Parse *)pTab->pIndex;
        (pParse != (Parse *)0x0 && (((ulong)pParse->pIdxExpr & 0x3000000) != 0x2000000));
        pParse = *(Parse **)&pParse->nRangeReg) {
    }
    iVar18 = 1;
    if (1 < *(ushort *)((long)&pParse->pConstExpr + 6)) {
      iVar18 = 1;
      uVar20 = 1;
      do {
        iVar9 = isDupColumn((Index *)pParse,iVar18,(Index *)pParse,(int)uVar20);
        if (iVar9 == 0) {
          lVar11 = (long)iVar18;
          *(undefined8 *)(*(long *)&pParse->iSelfTab + lVar11 * 8) =
               *(undefined8 *)(*(long *)&pParse->iSelfTab + uVar20 * 8);
          *(undefined1 *)(*(long *)&pParse->nMem + lVar11) =
               *(undefined1 *)(*(long *)&pParse->nMem + uVar20);
          iVar18 = iVar18 + 1;
          *(undefined2 *)(pParse->zErrMsg + lVar11 * 2) =
               *(undefined2 *)(pParse->zErrMsg + uVar20 * 2);
        }
        else {
          *(short *)&pParse->pIdxExpr = *(short *)&pParse->pIdxExpr + -1;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < *(ushort *)((long)&pParse->pConstExpr + 6));
    }
    *(short *)((long)&pParse->pConstExpr + 6) = (short)iVar18;
    goto LAB_0018be27;
  }
  local_40.z = pTab->aCol[pTab->iPKey].zCnName;
  if (local_40.z == (char *)0x0) {
    local_40.n = 0;
  }
  else {
    sVar13 = strlen(local_40.z);
    local_40.n = (uint)sVar13 & 0x3fffffff;
  }
  pExpr = sqlite3ExprAlloc(db,0x3b,&local_40,0);
  pList = sqlite3ExprListAppendNew(pParse->db,pExpr);
  if (pList == (ExprList *)0x0) {
LAB_0018be17:
    *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags & 0x7f;
    bVar8 = false;
  }
  else {
    if ((1 < pParse->eParseMode) && (pRVar15 = pParse->pRename, pRVar15 != (RenameToken *)0x0)) {
      do {
        if ((i16 *)pRVar15->p == &pTab->iPKey) {
          pRVar15->p = pList->a[0].pExpr;
          break;
        }
        pRVar15 = pRVar15->pNext;
      } while (pRVar15 != (RenameToken *)0x0);
    }
    pList->a[0].fg.sortFlags = pParse->iPkSortOrder;
    pTab->iPKey = -1;
    sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,(uint)pTab->keyConf,
                       (Token *)0x0,(Expr *)0x0,0,0,'\x02');
    if (pParse->nErr != 0) goto LAB_0018be17;
    bVar8 = true;
    for (pParse = (Parse *)pTab->pIndex;
        (pParse != (Parse *)0x0 && (((ulong)pParse->pIdxExpr & 0x3000000) != 0x2000000));
        pParse = *(Parse **)&pParse->nRangeReg) {
    }
  }
  if (!bVar8) {
    return;
  }
LAB_0018be27:
  uVar3 = *(ushort *)((long)&pParse->pIdxExpr + 3);
  *(ushort *)((long)&pParse->pIdxExpr + 3) = uVar3 | 0x20;
  if (((db->init).field_0x6 & 2) == 0) {
    *(ushort *)((long)&pParse->pIdxExpr + 3) = uVar3 | 0x28;
  }
  uVar3 = *(ushort *)((long)&pParse->pConstExpr + 6);
  uVar17 = (uint)uVar3;
  *(ushort *)&pParse->pIdxExpr = uVar3;
  if ((pVVar6 != (Vdbe *)0x0) && ((long)*(int *)&pParse->pConstExpr != 0)) {
    if (pVVar6->db->mallocFailed == '\0') {
      pOVar12 = pVVar6->aOp + *(int *)&pParse->pConstExpr;
    }
    else {
      pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar12->opcode = '\t';
  }
  *(Pgno *)&pParse->pConstExpr = pTab->tnum;
  pIdx = pTab->pIndex;
  if (pIdx != (Index *)0x0) {
    uVar16 = (uint)uVar3;
    do {
      cVar22 = '\n';
      if ((*(ushort *)&pIdx->field_0x63 & 3) != 2) {
        if (uVar16 == 0) {
          iVar18 = 0;
        }
        else {
          uVar4 = pIdx->nKeyCol;
          iVar18 = 0;
          uVar21 = 0;
          do {
            uVar10 = isDupColumn(pIdx,(uint)uVar4,(Index *)pParse,uVar21);
            iVar18 = iVar18 + (uVar10 ^ 1);
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
        if (iVar18 == 0) {
          pIdx->nColumn = pIdx->nKeyCol;
          cVar22 = '\n';
        }
        else {
          iVar18 = resizeIndexObject(db,pIdx,iVar18 + (uint)pIdx->nKeyCol);
          cVar22 = iVar18 != 0;
          if ((!(bool)cVar22) && (uVar3 != 0)) {
            uVar21 = (uint)pIdx->nKeyCol;
            uVar20 = 0;
            do {
              iVar18 = isDupColumn(pIdx,(uint)pIdx->nKeyCol,(Index *)pParse,(int)uVar20);
              if (iVar18 == 0) {
                pIdx->aiColumn[(int)uVar21] = *(i16 *)(pParse->zErrMsg + uVar20 * 2);
                pIdx->azColl[(int)uVar21] = *(char **)(*(long *)&pParse->iSelfTab + uVar20 * 8);
                if (*(char *)(*(long *)&pParse->nMem + uVar20) != '\0') {
                  pIdx->field_0x64 = pIdx->field_0x64 | 2;
                }
                uVar21 = uVar21 + 1;
              }
              uVar20 = uVar20 + 1;
            } while (uVar16 != uVar20);
            cVar22 = '\0';
          }
        }
      }
      if ((cVar22 != '\n') && (cVar22 != '\0')) {
        return;
      }
      pIdx = pIdx->pNext;
    } while (pIdx != (Index *)0x0);
  }
  uVar16 = (uint)uVar3;
  if ((long)pTab->nCol < 1) {
    iVar18 = 0;
  }
  else {
    uVar20 = 0;
    iVar18 = 0;
    psVar19 = (short *)pParse->zErrMsg;
    uVar21 = uVar16;
LAB_0018bff0:
    do {
      uVar10 = uVar21;
      if ((int)uVar10 < 1) {
LAB_0018c011:
        iVar18 = iVar18 + (uint)((pTab->aCol[uVar20].colFlags & 0x20) == 0);
      }
      else {
        sVar5 = *psVar19;
        psVar19 = psVar19 + 1;
        uVar21 = uVar10 - 1;
        if (uVar20 != (uint)(int)sVar5) goto LAB_0018bff0;
        if ((int)uVar10 < 1) goto LAB_0018c011;
      }
      uVar20 = uVar20 + 1;
      psVar19 = (short *)pParse->zErrMsg;
      uVar21 = uVar16;
    } while (uVar20 != (long)pTab->nCol);
  }
  iVar18 = resizeIndexObject(db,(Index *)pParse,iVar18 + uVar16);
  if (iVar18 == 0) {
    if (0 < pTab->nCol) {
      uVar20 = 0;
      do {
        psVar19 = (short *)pParse->zErrMsg;
        uVar16 = uVar17;
        do {
          uVar21 = uVar16;
          if ((int)uVar21 < 1) goto LAB_0018c08b;
          sVar5 = *psVar19;
          psVar19 = psVar19 + 1;
          uVar16 = uVar21 - 1;
        } while (uVar20 != (uint)(int)sVar5);
        if ((int)uVar21 < 1) {
LAB_0018c08b:
          if ((pTab->aCol[uVar20].colFlags & 0x20) == 0) {
            *(short *)((long)pParse->zErrMsg + (long)(int)uVar17 * 2) = (short)uVar20;
            *(char **)(*(long *)&pParse->iSelfTab + (long)(int)uVar17 * 8) = "BINARY";
            uVar17 = uVar17 + 1;
          }
        }
        uVar20 = uVar20 + 1;
      } while ((long)uVar20 < (long)pTab->nCol);
    }
    recomputeColumnsNotIndexed((Index *)pParse);
  }
  return;
}

Assistant:

static void convertToWithoutRowidTable(Parse *pParse, Table *pTab){
  Index *pIdx;
  Index *pPk;
  int nPk;
  int nExtra;
  int i, j;
  sqlite3 *db = pParse->db;
  Vdbe *v = pParse->pVdbe;

  /* Mark every PRIMARY KEY column as NOT NULL (except for imposter tables)
  */
  if( !db->init.imposterTable ){
    for(i=0; i<pTab->nCol; i++){
      if( (pTab->aCol[i].colFlags & COLFLAG_PRIMKEY)!=0
       && (pTab->aCol[i].notNull==OE_None)
      ){
        pTab->aCol[i].notNull = OE_Abort;
      }
    }
    pTab->tabFlags |= TF_HasNotNull;
  }

  /* Convert the P3 operand of the OP_CreateBtree opcode from BTREE_INTKEY
  ** into BTREE_BLOBKEY.
  */
  assert( !pParse->bReturning );
  if( pParse->u1.addrCrTab ){
    assert( v );
    sqlite3VdbeChangeP3(v, pParse->u1.addrCrTab, BTREE_BLOBKEY);
  }

  /* Locate the PRIMARY KEY index.  Or, if this table was originally
  ** an INTEGER PRIMARY KEY table, create a new PRIMARY KEY index.
  */
  if( pTab->iPKey>=0 ){
    ExprList *pList;
    Token ipkToken;
    sqlite3TokenInit(&ipkToken, pTab->aCol[pTab->iPKey].zCnName);
    pList = sqlite3ExprListAppend(pParse, 0,
                  sqlite3ExprAlloc(db, TK_ID, &ipkToken, 0));
    if( pList==0 ){
      pTab->tabFlags &= ~TF_WithoutRowid;
      return;
    }
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenRemap(pParse, pList->a[0].pExpr, &pTab->iPKey);
    }
    pList->a[0].fg.sortFlags = pParse->iPkSortOrder;
    assert( pParse->pNewTable==pTab );
    pTab->iPKey = -1;
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, pTab->keyConf, 0, 0, 0, 0,
                       SQLITE_IDXTYPE_PRIMARYKEY);
    if( pParse->nErr ){
      pTab->tabFlags &= ~TF_WithoutRowid;
      return;
    }
    assert( db->mallocFailed==0 );
    pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk->nKeyCol==1 );
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk!=0 );

    /*
    ** Remove all redundant columns from the PRIMARY KEY.  For example, change
    ** "PRIMARY KEY(a,b,a,b,c,b,c,d)" into just "PRIMARY KEY(a,b,c,d)".  Later
    ** code assumes the PRIMARY KEY contains no repeated columns.
    */
    for(i=j=1; i<pPk->nKeyCol; i++){
      if( isDupColumn(pPk, j, pPk, i) ){
        pPk->nColumn--;
      }else{
        testcase( hasColumn(pPk->aiColumn, j, pPk->aiColumn[i]) );
        pPk->azColl[j] = pPk->azColl[i];
        pPk->aSortOrder[j] = pPk->aSortOrder[i];
        pPk->aiColumn[j++] = pPk->aiColumn[i];
      }
    }
    pPk->nKeyCol = j;
  }
  assert( pPk!=0 );
  pPk->isCovering = 1;
  if( !db->init.imposterTable ) pPk->uniqNotNull = 1;
  nPk = pPk->nColumn = pPk->nKeyCol;

  /* Bypass the creation of the PRIMARY KEY btree and the sqlite_schema
  ** table entry. This is only required if currently generating VDBE
  ** code for a CREATE TABLE (not when parsing one as part of reading
  ** a database schema).  */
  if( v && pPk->tnum>0 ){
    assert( db->init.busy==0 );
    sqlite3VdbeChangeOpcode(v, (int)pPk->tnum, OP_Goto);
  }

  /* The root page of the PRIMARY KEY is the table root page */
  pPk->tnum = pTab->tnum;

  /* Update the in-memory representation of all UNIQUE indices by converting
  ** the final rowid column into one or more columns of the PRIMARY KEY.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int n;
    if( IsPrimaryKeyIndex(pIdx) ) continue;
    for(i=n=0; i<nPk; i++){
      if( !isDupColumn(pIdx, pIdx->nKeyCol, pPk, i) ){
        testcase( hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) );
        n++;
      }
    }
    if( n==0 ){
      /* This index is a superset of the primary key */
      pIdx->nColumn = pIdx->nKeyCol;
      continue;
    }
    if( resizeIndexObject(db, pIdx, pIdx->nKeyCol+n) ) return;
    for(i=0, j=pIdx->nKeyCol; i<nPk; i++){
      if( !isDupColumn(pIdx, pIdx->nKeyCol, pPk, i) ){
        testcase( hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) );
        pIdx->aiColumn[j] = pPk->aiColumn[i];
        pIdx->azColl[j] = pPk->azColl[i];
        if( pPk->aSortOrder[i] ){
          /* See ticket https://www.sqlite.org/src/info/bba7b69f9849b5bf */
          pIdx->bAscKeyBug = 1;
        }
        j++;
      }
    }
    assert( pIdx->nColumn>=pIdx->nKeyCol+n );
    assert( pIdx->nColumn>=j );
  }

  /* Add all table columns to the PRIMARY KEY index
  */
  nExtra = 0;
  for(i=0; i<pTab->nCol; i++){
    if( !hasColumn(pPk->aiColumn, nPk, i)
     && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ) nExtra++;
  }
  if( resizeIndexObject(db, pPk, nPk+nExtra) ) return;
  for(i=0, j=nPk; i<pTab->nCol; i++){
    if( !hasColumn(pPk->aiColumn, j, i)
     && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0
    ){
      assert( j<pPk->nColumn );
      pPk->aiColumn[j] = i;
      pPk->azColl[j] = sqlite3StrBINARY;
      j++;
    }
  }
  assert( pPk->nColumn==j );
  assert( pTab->nNVCol<=j );
  recomputeColumnsNotIndexed(pPk);
}